

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
trompeloeil::
trace_return<std::__cxx11::string,CATCH2_INTERNAL_TEST_25()::__11,std::tuple<int&>,void>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,trompeloeil *this,trace_agent *agent,anon_class_1_0_00000001_for_func *func,
          tuple<int_&> *params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  anon_class_1_0_00000001_for_func *local_28;
  tuple<int_&> *params_local;
  anon_class_1_0_00000001_for_func *func_local;
  trace_agent *agent_local;
  
  local_28 = func;
  params_local = (tuple<int_&> *)agent;
  func_local = (anon_class_1_0_00000001_for_func *)this;
  agent_local = (trace_agent *)__return_storage_ptr__;
  CATCH2_INTERNAL_TEST_25()::$_11::operator()(&local_48,(__11 *)agent,(tuple<int_&> *)func);
  trace_agent::trace_return<std::__cxx11::string>
            (__return_storage_ptr__,(trace_agent *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Ret
  trace_return(
    trace_agent& agent,
    F& func,
    P& params)
  {
    /* Work around VS 2017 15.7.x C4702 warning by
     * enclosing the operation in an otherwise
     * unnecessary try/catch block.
     */
    try
    {
      return agent.trace_return(func(params));
    }
    catch (...)
    {
      throw;
    }
  }